

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O2

void __thiscall duckdb::BuiltinFunctions::RegisterReadFunctions(BuiltinFunctions *this)

{
  DatabaseInstance *db;
  DBConfig *pDVar1;
  
  CSVCopyFunction::RegisterFunction(this);
  ReadCSVTableFunction::RegisterFunction(this);
  db = optional_ptr<duckdb::DatabaseInstance,_true>::operator*
                 ((optional_ptr<duckdb::DatabaseInstance,_true> *)this);
  pDVar1 = DBConfig::GetConfig(db);
  ::std::vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>>::
  emplace_back<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>(&)(duckdb::ClientContext&,duckdb::ReplacementScanInput&,duckdb::optional_ptr<duckdb::ReplacementScanData,true>)>
            ((vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>> *)
             &pDVar1->replacement_scans,ReadCSVReplacement);
  return;
}

Assistant:

void BuiltinFunctions::RegisterReadFunctions() {
	CSVCopyFunction::RegisterFunction(*this);
	ReadCSVTableFunction::RegisterFunction(*this);
	auto &config = DBConfig::GetConfig(*transaction.db);
	config.replacement_scans.emplace_back(ReadCSVReplacement);
}